

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerReinterpretPrimitive(Lowerer *this,Instr *instr)

{
  IRType type;
  Opnd *dst;
  Opnd *src;
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x529c,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar2) goto LAB_005a73af;
    *puVar3 = 0;
  }
  dst = instr->m_dst;
  src = instr->m_src1;
  if (TySize[dst->m_type] != TySize[src->m_type]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a0,"(dst->GetSize() == src1->GetSize())",
                       "dst->GetSize() == src1->GetSize()");
    if (!bVar2) goto LAB_005a73af;
    *puVar3 = 0;
  }
  type = dst->m_type;
  if (type == TyInt32) {
    if (src->m_type == TyFloat32) goto LAB_005a7384;
  }
  else if ((type == TyFloat32) && (src->m_type == TyInt32)) goto LAB_005a7384;
  bVar2 = IRType_IsInt64(type);
  if (((!bVar2) || (src->m_type != TyFloat64)) &&
     ((dst->m_type != TyFloat64 || (bVar2 = IRType_IsInt64(src->m_type), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52a4,
                       "((dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64()))"
                       ,
                       "(dst->IsFloat32() && src1->IsInt32()) || (dst->IsInt32() && src1->IsFloat32()) || (dst->IsInt64() && src1->IsFloat64()) || (dst->IsFloat64() && src1->IsInt64())"
                      );
    if (!bVar2) {
LAB_005a73af:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
LAB_005a7384:
  LowererMD::EmitReinterpretPrimitive(&this->m_lowererMD,dst,src,instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerReinterpretPrimitive(IR::Instr* instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* dst =  instr->GetDst();

    Assert(dst->GetSize() == src1->GetSize());
    Assert((dst->IsFloat32() && src1->IsInt32()) ||
           (dst->IsInt32() && src1->IsFloat32()) ||
           (dst->IsInt64() && src1->IsFloat64()) ||
           (dst->IsFloat64() && src1->IsInt64()) );

    m_lowererMD.EmitReinterpretPrimitive(dst, src1, instr);
    instr->Remove();
}